

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::trimCommandPoolTest
          (TestStatus *__return_storage_ptr__,Context *context,VkCommandBufferLevel cmdBufferLevel)

{
  pointer *this;
  VkCommandPool pool;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  VkCommandBufferLevel VVar1;
  Context *pCVar2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  NotSupportedError *this_00;
  VkDevice device;
  DeviceInterface *vk_00;
  Handle<(vk::HandleType)24> *pHVar5;
  reference ppVVar6;
  size_type sVar7;
  allocator<char> local_271;
  string local_270;
  VkCommandPool local_250;
  deUint64 local_248;
  uint local_240;
  allocator<char> local_239;
  deUint32 bufferNdx;
  deUint64 local_218;
  allocator<char> local_209;
  string local_208;
  deUint64 local_1e8;
  deUint64 local_1e0;
  allocator<char> local_1d1;
  string local_1d0;
  deUint64 local_1b0;
  int local_1a8;
  allocator<char> local_1a1;
  string local_1a0;
  VkCommandPool local_180;
  allocator<vk::VkCommandBuffer_s_*> local_171;
  undefined1 local_170 [8];
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> cmdBuffersPeak;
  deUint32 cmdBufferIterationrNdx;
  allocator<vk::VkCommandBuffer_s_*> local_141;
  undefined1 local_140 [8];
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> cmdBuffers;
  value_type local_108;
  uint local_f4;
  undefined1 local_f0 [4];
  deUint32 ndx;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  events;
  RefData<vk::Handle<(vk::HandleType)24>_> local_b8;
  undefined1 local_98 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolParams;
  deUint32 cmdBufferCount;
  deUint32 cmdBufferIterationCount;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice vkDevice;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  VkCommandBufferLevel local_1c;
  Context *pCStack_18;
  VkCommandBufferLevel cmdBufferLevel_local;
  Context *context_local;
  
  local_1c = cmdBufferLevel;
  pCStack_18 = context;
  context_local = (Context *)__return_storage_ptr__;
  pvVar4 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(pvVar4);
  pvVar4 = Context::getDeviceExtensions_abi_cxx11_(pCStack_18);
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(pvVar4);
  bVar3 = de::
          contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                    (&local_28,&local_30,(char (*) [20])0x1329e7b);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Extension VK_KHR_maintenance1 not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
               ,0x4cc);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  device = Context::getDevice(pCStack_18);
  vk_00 = Context::getDeviceInterface(pCStack_18);
  Context::getUniversalQueueFamilyIndex(pCStack_18);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  this = &events.
          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)this,vk_00,device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b8,(Move *)this);
  data.deleter.m_deviceIface = local_b8.deleter.m_deviceIface;
  data.object.m_internal = local_b8.object.m_internal;
  data.deleter.m_device = local_b8.deleter.m_device;
  data.deleter.m_allocator = local_b8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_98,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &events.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
            *)local_f0);
  for (local_f4 = 0; local_f4 < 10; local_f4 = local_f4 + 1) {
    ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)
                      &cmdBuffers.
                       super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,vk_00,device,0,
                      (VkAllocationCallbacks *)0x0);
    api::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)10>>
              ((_anonymous_namespace_ *)&local_108,
               (Move<vk::Handle<(vk::HandleType)10>_> *)
               &cmdBuffers.
                super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                 *)local_f0,&local_108);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>::~SharedPtr(&local_108);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)10>_> *)
               &cmdBuffers.
                super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::allocator<vk::VkCommandBuffer_s_*>::allocator(&local_141);
  std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
            ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)local_140,
             10,&local_141);
  std::allocator<vk::VkCommandBuffer_s_*>::~allocator(&local_141);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_98);
  VVar1 = local_1c;
  pool.m_internal = pHVar5->m_internal;
  ppVVar6 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
            operator[]((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
                       local_140,0);
  createCommadBuffers(vk_00,device,10,pool,VVar1,ppVVar6);
  cmdBuffersPeak.
  super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  do {
    if (299 < cmdBuffersPeak.
              super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
      local_1a8 = 0;
LAB_00848a39:
      std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::~vector
                ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
                 local_140);
      if (local_1a8 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"Pass",&local_271);
        tcu::TestStatus::pass(__return_storage_ptr__,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator(&local_271);
        local_1a8 = 1;
      }
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
      ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                 *)local_f0);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_98);
      return __return_storage_ptr__;
    }
    addCommandsToBuffer(vk_00,(vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                               *)local_140,
                        (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                         *)local_f0);
    if (cmdBuffersPeak.
        super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ % 10 == 0) {
      std::allocator<vk::VkCommandBuffer_s_*>::allocator(&local_171);
      std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
                ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
                 local_170,100,&local_171);
      std::allocator<vk::VkCommandBuffer_s_*>::~allocator(&local_171);
      sVar7 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::size
                        ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                          *)local_170);
      pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_98);
      VVar1 = local_1c;
      local_180.m_internal = pHVar5->m_internal;
      ppVVar6 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
                operator[]((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                            *)local_170,0);
      createCommadBuffers(vk_00,device,(deUint32)sVar7,local_180,VVar1,ppVVar6);
      addCommandsToBuffer(vk_00,(vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                                 *)local_170,
                          (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                           *)local_f0);
      pCVar2 = pCStack_18;
      if (local_1c == VK_COMMAND_BUFFER_LEVEL_PRIMARY) {
        bVar3 = submitAndCheck(pCStack_18,
                               (vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                                *)local_170,
                               (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                                *)local_f0);
        if (bVar3) goto LAB_008485fe;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"Fail",&local_1a1);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::allocator<char>::~allocator(&local_1a1);
        local_1a8 = 1;
      }
      else {
        if (local_1c == VK_COMMAND_BUFFER_LEVEL_SECONDARY) {
          pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                             ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_98);
          local_1b0 = pHVar5->m_internal;
          bVar3 = executeSecondaryCmdBuffer
                            (pCVar2,(VkCommandPool)local_1b0,
                             (vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                              *)local_170,
                             (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                              *)local_f0);
          if (!bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,"Fail",&local_1d1);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_1d0);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::allocator<char>::~allocator(&local_1d1);
            local_1a8 = 1;
            goto LAB_00848689;
          }
        }
LAB_008485fe:
        pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                           ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_98);
        local_1e0 = pHVar5->m_internal;
        sVar7 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::size
                          ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                            *)local_170);
        ppVVar6 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
                  operator[]((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                              *)local_170,0);
        (*vk_00->_vptr_DeviceInterface[0x48])(vk_00,device,local_1e0,sVar7 & 0xffffffff,ppVVar6);
        local_1a8 = 0;
      }
LAB_00848689:
      std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::~vector
                ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
                 local_170);
      if (local_1a8 != 0) goto LAB_00848a39;
    }
    pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_98);
    local_1e8 = pHVar5->m_internal;
    (*vk_00->_vptr_DeviceInterface[0x7e])(vk_00,device,local_1e8,0);
    pCVar2 = pCStack_18;
    if (local_1c == VK_COMMAND_BUFFER_LEVEL_PRIMARY) {
      bVar3 = submitAndCheck(pCStack_18,
                             (vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                              *)local_140,
                             (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                              *)local_f0);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Fail",&local_209);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator(&local_209);
        local_1a8 = 1;
        goto LAB_00848a39;
      }
    }
    else if (local_1c == VK_COMMAND_BUFFER_LEVEL_SECONDARY) {
      pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_98);
      local_218 = pHVar5->m_internal;
      bVar3 = executeSecondaryCmdBuffer
                        (pCVar2,(VkCommandPool)local_218,
                         (vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                          *)local_140,
                         (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
                          *)local_f0);
      if (!bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&bufferNdx,"Fail",&local_239);
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)&bufferNdx);
        std::__cxx11::string::~string((string *)&bufferNdx);
        std::allocator<char>::~allocator(&local_239);
        local_1a8 = 1;
        goto LAB_00848a39;
      }
    }
    for (local_240 = cmdBuffersPeak.
                     super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ % 3; local_240 < 10;
        local_240 = local_240 + 2) {
      pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_98);
      local_248 = pHVar5->m_internal;
      ppVVar6 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
                operator[]((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                            *)local_140,(ulong)local_240);
      (*vk_00->_vptr_DeviceInterface[0x48])(vk_00,device,local_248,1,ppVVar6);
      pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_98);
      VVar1 = local_1c;
      local_250.m_internal = pHVar5->m_internal;
      ppVVar6 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
                operator[]((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                            *)local_140,(ulong)local_240);
      createCommadBuffers(vk_00,device,1,local_250,VVar1,ppVVar6);
    }
    cmdBuffersPeak.
    super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         cmdBuffersPeak.
         super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus trimCommandPoolTest (Context& context, const VkCommandBufferLevel cmdBufferLevel)
{
	if (!de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1"))
		TCU_THROW(NotSupportedError, "Extension VK_KHR_maintenance1 not supported");

	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	//test parameters
	const deUint32							cmdBufferIterationCount	= 300u;
	const deUint32							cmdBufferCount			= 10u;

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	std::vector <VkEventShared>				events;
	for (deUint32 ndx = 0u; ndx < cmdBufferCount; ++ndx)
		events.push_back(makeSharedPtr(createEvent(vk, vkDevice)));

	{
		std::vector<VkCommandBuffer> cmdBuffers(cmdBufferCount);
		createCommadBuffers(vk, vkDevice, cmdBufferCount, *cmdPool, cmdBufferLevel, &cmdBuffers[0]);

		for (deUint32 cmdBufferIterationrNdx = 0; cmdBufferIterationrNdx < cmdBufferIterationCount; ++cmdBufferIterationrNdx)
		{
			addCommandsToBuffer(vk, cmdBuffers, events);

			//Peak, situation when we use a lot more command buffers
			if (cmdBufferIterationrNdx % 10u == 0)
			{
				std::vector<VkCommandBuffer> cmdBuffersPeak(cmdBufferCount * 10u);
				createCommadBuffers(vk, vkDevice, static_cast<deUint32>(cmdBuffersPeak.size()), *cmdPool, cmdBufferLevel, &cmdBuffersPeak[0]);
				addCommandsToBuffer(vk, cmdBuffersPeak, events);

				switch(cmdBufferLevel)
				{
					case VK_COMMAND_BUFFER_LEVEL_PRIMARY:
						if (!submitAndCheck(context, cmdBuffersPeak, events))
							return tcu::TestStatus::fail("Fail");
						break;
					case VK_COMMAND_BUFFER_LEVEL_SECONDARY:
						if (!executeSecondaryCmdBuffer(context, *cmdPool, cmdBuffersPeak, events))
							return tcu::TestStatus::fail("Fail");
						break;
					default:
						DE_ASSERT(0);
				}
				vk.freeCommandBuffers(vkDevice, *cmdPool, static_cast<deUint32>(cmdBuffersPeak.size()), &cmdBuffersPeak[0]);
			}

			vk.trimCommandPoolKHR(vkDevice, *cmdPool, (VkCommandPoolTrimFlagsKHR)0);

			switch(cmdBufferLevel)
			{
				case VK_COMMAND_BUFFER_LEVEL_PRIMARY:
					if (!submitAndCheck(context, cmdBuffers, events))
						return tcu::TestStatus::fail("Fail");
					break;
				case VK_COMMAND_BUFFER_LEVEL_SECONDARY:
					if (!executeSecondaryCmdBuffer(context, *cmdPool, cmdBuffers, events))
						return tcu::TestStatus::fail("Fail");
					break;
				default:
					DE_ASSERT(0);
			}

			for (deUint32 bufferNdx = cmdBufferIterationrNdx % 3u; bufferNdx < cmdBufferCount; bufferNdx+=2u)
			{
				vk.freeCommandBuffers(vkDevice, *cmdPool, 1u, &cmdBuffers[bufferNdx]);
				createCommadBuffers(vk, vkDevice, 1u, *cmdPool, cmdBufferLevel, &cmdBuffers[bufferNdx]);
			}
		}
	}

	return tcu::TestStatus::pass("Pass");
}